

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMNodeImpl::release(DOMNodeImpl *this)

{
  DOMException *this_00;
  DOMDocument *pDVar1;
  DOMNode *pDVar2;
  
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  pDVar1 = getOwnerDocument(this);
  if (pDVar1 == (DOMDocument *)0x0) {
    pDVar2 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
  }
  else {
    pDVar1 = getOwnerDocument(this);
    pDVar2 = &pDVar1[10].super_DOMNode;
  }
  DOMException::DOMException(this_00,0xf,0,(MemoryManager *)pDVar2->_vptr_DOMNode);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMNodeImpl::release()
{
    // shouldn't reach here
    throw DOMException(DOMException::INVALID_ACCESS_ERR,0, GetDOMNodeMemoryManager);
}